

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O0

void version(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  undefined8 *in_RSI;
  size_type pos;
  string argv0;
  string local_70 [32];
  long local_50;
  allocator local_31;
  string local_30 [48];
  
  pcVar1 = (char *)*in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_50 = std::__cxx11::string::rfind((char)local_30,0x2f);
  if (local_50 != -1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_30);
    std::__cxx11::string::operator=(local_30,local_70);
    std::__cxx11::string::~string(local_70);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,local_30);
  poVar2 = std::operator<<(poVar2," -- ");
  poVar2 = std::operator<<(poVar2,"1a02b19");
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::operator<<(poVar2,"Sat, 9 Apr 2022 11:08:45 -0700");
  poVar2 = std::operator<<(poVar2,")");
  this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Part of goestools (https://github.com/pietern/goestools)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Written by Pieter Noordhuis and contributors");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void version(int argc, char** argv) {
  std::string argv0(argv[0]);
  auto pos = argv0.rfind('/');
  if (pos != std::string::npos) {
    argv0 = argv0.substr(pos + 1);
  }

  std::cout
    << argv0
    << " -- " << GIT_COMMIT_HASH
    << " (" << GIT_COMMIT_DATE << ")"
    << std::endl
    << std::endl;
  std::cout
    << "Part of goestools (https://github.com/pietern/goestools)"
    << std::endl;
  std::cout
    << "Written by Pieter Noordhuis and contributors"
    << std::endl;
}